

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

string * cmQtAutoGen::GeneratorName_abi_cxx11_(GenT genType)

{
  if (genType - MOC < 3) {
    return (string *)(&PTR_GenAutoMoc_abi_cxx11__00629c60)[genType - MOC];
  }
  return &GenAutoGen_abi_cxx11_;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorName(GenT genType)
{
  switch (genType) {
    case GenT::GEN:
      return GenAutoGen;
    case GenT::MOC:
      return GenAutoMoc;
    case GenT::UIC:
      return GenAutoUic;
    case GenT::RCC:
      return GenAutoRcc;
  }
  return GenAutoGen;
}